

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O3

GLuint __thiscall
gl4cts::EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::gcd
          (UniformBlockMemberOverlappingOffsetsTest *this,GLuint a,GLuint b)

{
  uint uVar1;
  
  if (a == 0 || b != 0) {
    do {
      uVar1 = a;
      if (b < a) {
        uVar1 = b;
        b = a;
      }
      a = uVar1;
      b = b % a;
    } while (b != 0);
  }
  return a;
}

Assistant:

GLuint UniformBlockMemberOverlappingOffsetsTest::gcd(GLuint a, GLuint b)
{
	if ((0 != a) && (0 == b))
	{
		return a;
	}
	else
	{
		GLuint greater = std::max(a, b);
		GLuint lesser  = std::min(a, b);

		return gcd(lesser, greater % lesser);
	}
}